

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateParsingCode
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  JavaType JVar1;
  FieldDescriptor *field;
  char *text;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "if (!$get_mutable_bit_parser$) {\n  $name$_ = com.google.protobuf.MapField.newMapField(\n      $map_field_parameter$);\n  $set_mutable_bit_parser$;\n}\n"
                    );
  text = 
  "com.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = input.readMessage(\n    $default_entry$.getParserForType(), extensionRegistry);\n$name$_.getMutableMap().put(\n    $name$__.getKey(), $name$__.getValue());\n"
  ;
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) != 3) {
    field = anon_unknown_5::ValueField(this->descriptor_);
    JVar1 = GetJavaType(field);
    if (JVar1 == JAVATYPE_ENUM) {
      io::Printer::Print(printer,variables,
                         "com.google.protobuf.ByteString bytes = input.readBytes();\ncom.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = $default_entry$.getParserForType().parseFrom(bytes);\n"
                        );
      text = 
      "if ($value_enum_type$.forNumber($name$__.getValue()) == null) {\n  unknownFields.mergeLengthDelimitedField($number$, bytes);\n} else {\n  $name$_.getMutableMap().put(\n      $name$__.getKey(), $name$__.getValue());\n}\n"
      ;
    }
  }
  io::Printer::Print(printer,variables,text);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(
      variables_,
      "if (!$get_mutable_bit_parser$) {\n"
      "  $name$_ = com.google.protobuf.MapField.newMapField(\n"
      "      $map_field_parameter$);\n"
      "  $set_mutable_bit_parser$;\n"
      "}\n");
  if (!SupportUnknownEnumValue(descriptor_->file()) &&
      GetJavaType(ValueField(descriptor_)) == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "com.google.protobuf.ByteString bytes = input.readBytes();\n"
        "com.google.protobuf.MapEntry<$type_parameters$>\n"
        "$name$__ = $default_entry$.getParserForType().parseFrom(bytes);\n");
    printer->Print(
        variables_,
        "if ($value_enum_type$.forNumber($name$__.getValue()) == null) {\n"
        "  unknownFields.mergeLengthDelimitedField($number$, bytes);\n"
        "} else {\n"
        "  $name$_.getMutableMap().put(\n"
        "      $name$__.getKey(), $name$__.getValue());\n"
        "}\n");
  } else {
    printer->Print(
        variables_,
        "com.google.protobuf.MapEntry<$type_parameters$>\n"
        "$name$__ = input.readMessage(\n"
        "    $default_entry$.getParserForType(), extensionRegistry);\n"
        "$name$_.getMutableMap().put(\n"
        "    $name$__.getKey(), $name$__.getValue());\n");
  }
}